

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O2

void doTest(int w,int h,int *formats,int nformats,int subsamp,char *basename)

{
  uint subsamp_00;
  int iVar1;
  tjhandle pvVar2;
  uchar *srcBuf;
  unsigned_long __size;
  uchar *puVar3;
  FILE *__s;
  size_t sVar4;
  int *piVar5;
  uchar uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  uchar uVar12;
  uchar *puVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  bool bVar17;
  int iVar18;
  tjhandle local_4d8;
  uchar *dstBuf;
  char *local_4c0;
  uchar *local_4b8;
  unsigned_long size;
  uint local_4a4;
  char *local_4a0;
  char *local_498;
  tjhandle local_490;
  char *local_488;
  long local_480;
  int local_474;
  ulong local_470;
  ulong local_468;
  char *local_460;
  long local_458;
  int *local_450;
  ulong local_448;
  char *local_440;
  char local_438 [1032];
  
  dstBuf = (uchar *)0x0;
  size = 0;
  local_460 = basename;
  local_450 = formats;
  if (((alloc == 0) && (size = tjBufSize(w,h,subsamp), size != 0)) &&
     (dstBuf = tjAlloc((int)size), dstBuf == (uchar *)0x0)) {
    printf("ERROR: %s\n","Memory allocation failure.");
    exitStatus = -1;
  }
  else {
    pvVar2 = tjInitCompress();
    if ((pvVar2 == (tjhandle)0x0) || (local_4d8 = tjInitDecompress(), local_4d8 == (tjhandle)0x0)) {
      pcVar15 = tjGetErrorStr();
      local_4d8 = (tjhandle)0x0;
      printf("TurboJPEG ERROR:\n%s\n",pcVar15);
      exitStatus = -1;
    }
    else {
      uVar14 = 0;
      if (0 < w) {
        uVar14 = (ulong)(uint)w;
      }
      local_4a4 = 0;
      if (0 < h) {
        local_4a4 = h;
      }
      if (nformats < 1) {
        nformats = 0;
      }
      local_468 = (ulong)(uint)nformats;
      local_470 = (ulong)(subsamp - 1);
      local_458 = (long)(h * w);
      uVar10 = 0;
      local_4a0 = (char *)(ulong)(uint)subsamp;
      local_498 = (char *)(ulong)(uint)subsamp;
      local_490 = pvVar2;
      while (uVar10 != local_468) {
        iVar1 = 0;
        local_448 = uVar10;
        while (iVar1 != 2) {
          uVar7 = 0;
          if ((uint)local_470 < 5) {
            uVar7 = *(uint *)(&DAT_001578a8 + local_470 * 4);
          }
          subsamp_00 = uVar7 | 2;
          if (iVar1 != 1) {
            subsamp_00 = uVar7;
          }
          bVar17 = (subsamp_00 & 2) == 0;
          pcVar15 = "Bottom-Up";
          if (bVar17) {
            pcVar15 = "Top-Down ";
          }
          iVar18 = local_450[local_448];
          lVar8 = (long)iVar18;
          local_440 = "BU";
          if (bVar17) {
            local_440 = "TD";
          }
          local_488 = pixFormatStr[lVar8];
          lVar16 = (long)tjPixelSize[lVar8];
          local_4c0 = (char *)(local_458 * lVar16);
          local_474 = iVar1;
          srcBuf = (uchar *)malloc((size_t)local_4c0);
          local_480 = lVar8;
          if (srcBuf == (uchar *)0x0) {
            printf("ERROR: %s\n","Memory allocation failure");
LAB_001074d2:
            exitStatus = -1;
            puVar3 = (uchar *)0x0;
            pcVar11 = local_4a0;
            uVar9 = h;
          }
          else {
            if (iVar18 == 0xb) {
              memset(srcBuf,0xff,(size_t)local_4c0);
              for (uVar7 = 0; uVar7 != local_4a4; uVar7 = uVar7 + 1) {
                uVar9 = ~uVar7 + h;
                if ((subsamp_00 & 2) == 0) {
                  uVar9 = uVar7;
                }
                puVar3 = srcBuf + lVar16 * (int)(uVar9 * w) + 3;
                for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
                  if ((((uint)(uVar10 >> 3) & 0x1fffffff) + (uVar7 >> 3) & 1) == 0) {
                    puVar13 = puVar3;
                    if (0xf < uVar7) {
LAB_00107085:
                      *puVar13 = '\0';
                    }
                  }
                  else {
                    puVar3[-1] = '\0';
                    if (uVar7 < 0x10) {
                      puVar13 = srcBuf + (uVar10 + (long)(int)(uVar9 * w)) * lVar16 + 1;
                      goto LAB_00107085;
                    }
                  }
                  puVar3 = puVar3 + lVar16;
                }
              }
            }
            else if (iVar18 == 6) {
              memset(srcBuf,0,(size_t)local_4c0);
              for (uVar7 = 0; uVar7 != local_4a4; uVar7 = uVar7 + 1) {
                uVar9 = ~uVar7 + h;
                if ((subsamp_00 & 2) == 0) {
                  uVar9 = uVar7;
                }
                uVar6 = 0xe2;
                if (uVar7 < 0x10) {
                  uVar6 = 'L';
                }
                for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
                  uVar12 = -(uVar7 < 0x10);
                  if ((((uint)(uVar10 >> 3) & 0x1fffffff) + (uVar7 >> 3) & 1) != 0) {
                    uVar12 = uVar6;
                  }
                  srcBuf[uVar10 + (long)(int)(uVar9 * w)] = uVar12;
                }
              }
            }
            else {
              local_4b8 = (uchar *)(long)tjBlueOffset[lVar8];
              iVar1 = tjGreenOffset[lVar8];
              iVar18 = tjRedOffset[lVar8];
              memset(srcBuf,0,(size_t)local_4c0);
              for (uVar7 = 0; uVar7 != local_4a4; uVar7 = uVar7 + 1) {
                uVar9 = ~uVar7 + h;
                if ((subsamp_00 & 2) == 0) {
                  uVar9 = uVar7;
                }
                puVar3 = srcBuf + lVar16 * (int)(uVar9 * w);
                for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
                  if ((((uint)(uVar10 >> 3) & 0x1fffffff) + (uVar7 >> 3) & 1) == 0) {
                    if (uVar7 < 0x10) {
                      puVar3[iVar18] = 0xff;
                      puVar3[iVar1] = 0xff;
                      puVar13 = local_4b8 + (long)puVar3;
LAB_00107160:
                      *puVar13 = 0xff;
                    }
                  }
                  else {
                    puVar3[iVar18] = 0xff;
                    if (0xf < uVar7) {
                      puVar13 = srcBuf + (uVar10 + (long)(int)(uVar9 * w)) * lVar16 + (long)iVar1;
                      goto LAB_00107160;
                    }
                  }
                  puVar3 = puVar3 + lVar16;
                }
              }
            }
            if ((dstBuf != (uchar *)0x0) && (size != 0)) {
              memset(dstBuf,0,size);
            }
            pcVar11 = local_4a0;
            uVar7 = subsamp_00 | 0x400;
            if (alloc != 0) {
              uVar7 = subsamp_00;
            }
            iVar1 = (int)local_4a0;
            if (doYUV != 0) {
              __size = tjBufSizeYUV2(w,pad,h,iVar1);
              pvVar2 = tjInitCompress();
              if (pvVar2 == (tjhandle)0x0) {
                pcVar15 = tjGetErrorStr();
                pcVar11 = "TurboJPEG ERROR:\n%s\n";
              }
              else {
                puVar3 = (uchar *)calloc(1,__size);
                if (puVar3 != (uchar *)0x0) {
                  local_4c0 = pcVar15;
                  printf("%s %s -> YUV %s ... ",local_488,pcVar15);
                  pcVar11 = local_4a0;
                  iVar18 = (int)local_4a0;
                  local_4b8 = puVar3;
                  iVar1 = tjEncodeYUV3(pvVar2,srcBuf,w,0,h,(int)local_480,puVar3,pad,iVar18,uVar7);
                  uVar9 = h;
                  if (iVar1 != -1) {
                    tjDestroy(pvVar2);
                    puVar3 = local_4b8;
                    uVar9 = h;
                    iVar1 = checkBufYUV(local_4b8,w,h,iVar18,(tjscalingfactor)0x100000001);
                    pcVar15 = "Passed.";
                    if (iVar1 == 0) {
                      pcVar15 = "FAILED!";
                    }
                    puts(pcVar15);
                    printf("YUV %s %s -> JPEG Q%d ... ",subNameLong[(long)local_498],local_4c0,100);
                    iVar1 = tjCompressFromYUV(local_490,puVar3,w,pad,h,iVar18,&dstBuf,&size,100,
                                              uVar7);
                    if (iVar1 != -1) goto LAB_001073c4;
                  }
                  pcVar15 = tjGetErrorStr();
                  printf("TurboJPEG ERROR:\n%s\n",pcVar15);
                  exitStatus = -1;
                  puVar3 = local_4b8;
                  goto LAB_00107550;
                }
                pcVar11 = "ERROR: %s\n";
                pcVar15 = "Memory allocation failure";
              }
              printf(pcVar11,pcVar15);
              goto LAB_001074d2;
            }
            uVar9 = h;
            printf("%s %s -> %s Q%d ... ",local_488,pcVar15,subNameLong[(long)local_498],100);
            iVar1 = tjCompress2(local_490,srcBuf,w,0,h,(int)local_480,&dstBuf,&size,iVar1,100,uVar7)
            ;
            if (iVar1 == -1) {
              pcVar15 = tjGetErrorStr();
              printf("TurboJPEG ERROR:\n%s\n",pcVar15);
              exitStatus = -1;
              puVar3 = (uchar *)0x0;
            }
            else {
              local_4b8 = (uchar *)0x0;
LAB_001073c4:
              snprintf(local_438,0x400,"%s_enc_%s_%s_%s_Q%d.jpg",local_460,local_488,local_440,
                       subName[(long)local_498],100);
              puVar3 = dstBuf;
              local_4c0 = (char *)size;
              __s = fopen(local_438,"wb");
              if (__s == (FILE *)0x0) {
                piVar5 = __errno_location();
                pcVar15 = strerror(*piVar5);
                printf("ERROR: Could not write to %s.\n%s\n",local_438,pcVar15);
                exitStatus = -1;
              }
              else {
                sVar4 = fwrite(puVar3,(size_t)local_4c0,1,__s);
                if (sVar4 != 1) {
                  piVar5 = __errno_location();
                  pcVar15 = strerror(*piVar5);
                  printf("ERROR: Could not write to %s.\n%s\n",local_438,pcVar15);
                  exitStatus = -1;
                }
                fclose(__s);
              }
              printf("Done.\n  Result in %s\n",local_438);
              puVar3 = local_4b8;
            }
          }
LAB_00107550:
          free(puVar3);
          free(srcBuf);
          iVar1 = (int)local_480;
          decompTest(local_4d8,dstBuf,size,w,uVar9,iVar1,pcVar11,subsamp_00,uVar9);
          h = uVar9;
          if (iVar1 - 2U < 4) {
            putchar(10);
            decompTest(local_4d8,dstBuf,size,w,uVar9,iVar1 + 5,pcVar11,subsamp_00,uVar9);
            h = uVar9;
          }
          putchar(10);
          iVar1 = local_474 + 1;
        }
        uVar10 = local_448 + 1;
      }
      puts("--------------------\n");
      pvVar2 = local_490;
    }
    if (pvVar2 != (tjhandle)0x0) {
      tjDestroy(pvVar2);
    }
    if (local_4d8 != (tjhandle)0x0) {
      tjDestroy(local_4d8);
    }
  }
  tjFree(dstBuf);
  return;
}

Assistant:

static void doTest(int w, int h, const int *formats, int nformats, int subsamp,
                   char *basename)
{
  tjhandle chandle = NULL, dhandle = NULL;
  unsigned char *dstBuf = NULL;
  unsigned long size = 0;
  int pfi, pf, i;

  if (!alloc)
    size = tjBufSize(w, h, subsamp);
  if (size != 0)
    if ((dstBuf = (unsigned char *)tjAlloc(size)) == NULL)
      THROW("Memory allocation failure.");

  if ((chandle = tjInitCompress()) == NULL ||
      (dhandle = tjInitDecompress()) == NULL)
    THROW_TJ();

  for (pfi = 0; pfi < nformats; pfi++) {
    for (i = 0; i < 2; i++) {
      int flags = 0;

      if (subsamp == TJSAMP_422 || subsamp == TJSAMP_420 ||
          subsamp == TJSAMP_440 || subsamp == TJSAMP_411)
        flags |= TJFLAG_FASTUPSAMPLE;
      if (i == 1) flags |= TJFLAG_BOTTOMUP;
      pf = formats[pfi];
      compTest(chandle, &dstBuf, &size, w, h, pf, basename, subsamp, 100,
               flags);
      decompTest(dhandle, dstBuf, size, w, h, pf, basename, subsamp, flags);
      if (pf >= TJPF_RGBX && pf <= TJPF_XRGB) {
        printf("\n");
        decompTest(dhandle, dstBuf, size, w, h, pf + (TJPF_RGBA - TJPF_RGBX),
                   basename, subsamp, flags);
      }
      printf("\n");
    }
  }
  printf("--------------------\n\n");

bailout:
  if (chandle) tjDestroy(chandle);
  if (dhandle) tjDestroy(dhandle);
  tjFree(dstBuf);
}